

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Variability>::operator=
          (optional<tinyusdz::Variability> *this,optional<tinyusdz::Variability> *other)

{
  value_type vVar1;
  bool bVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  optional<tinyusdz::Variability> *other_local;
  optional<tinyusdz::Variability> *this_local;
  
  bVar2 = has_value(this);
  if ((!bVar2) || (bVar2 = has_value(other), bVar2)) {
    bVar2 = has_value(this);
    if ((bVar2) || (bVar2 = has_value(other), !bVar2)) {
      bVar2 = has_value(this);
      if ((bVar2) && (bVar2 = has_value(other), bVar2)) {
        pvVar3 = operator*(other);
        vVar1 = *pvVar3;
        pvVar4 = detail::storage_t<tinyusdz::Variability>::value
                           ((storage_t<tinyusdz::Variability> *)&this->contained);
        *pvVar4 = vVar1;
      }
    }
    else {
      pvVar3 = operator*(other);
      initialize<tinyusdz::Variability>(this,pvVar3);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }